

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_test.c
# Opt level: O0

int main(void)

{
  int iVar1;
  uint uVar2;
  unsigned_long_long mlen;
  unsigned_long_long smlen;
  int ret;
  uchar sm [126340];
  uchar omessage [50];
  uchar message [50];
  uchar sk [97];
  uchar pk [65];
  undefined1 auStackY_1eec8 [64];
  uchar *in_stack_fffffffffffe1178;
  unsigned_long_long in_stack_fffffffffffe1180;
  uchar *in_stack_fffffffffffe1188;
  unsigned_long_long *in_stack_fffffffffffe1190;
  uchar *in_stack_fffffffffffe1198;
  unsigned_long_long *in_stack_fffffffffffe11a0;
  uchar *in_stack_fffffffffffe11a8;
  uchar *in_stack_fffffffffffe11c0;
  uchar *in_stack_fffffffffffe11c8;
  undefined1 local_138 [64];
  undefined1 local_f8 [64];
  undefined1 local_b8 [112];
  undefined1 local_48 [68];
  undefined4 local_4;
  
  local_4 = 0;
  memset(local_48,0,0x41);
  memset(local_b8,0,0x61);
  memset(local_f8,0,0x32);
  memset(local_138,0,0x32);
  memset(auStackY_1eec8,0,0x1ed84);
  iVar1 = crypto_sign_keypair(in_stack_fffffffffffe11c8,in_stack_fffffffffffe11c0);
  if (iVar1 == 0) {
    iVar1 = crypto_sign(in_stack_fffffffffffe11a8,in_stack_fffffffffffe11a0,
                        in_stack_fffffffffffe1198,(unsigned_long_long)in_stack_fffffffffffe1190,
                        in_stack_fffffffffffe1188);
    if (iVar1 == 0) {
      uVar2 = crypto_sign_open(in_stack_fffffffffffe1198,in_stack_fffffffffffe1190,
                               in_stack_fffffffffffe1188,in_stack_fffffffffffe1180,
                               in_stack_fffffffffffe1178);
      if (uVar2 == 0) {
        iVar1 = memcmp(local_f8,local_138,0x32);
        if (iVar1 == 0) {
          memcpy(auStackY_1eec8,local_f8,0x32);
          iVar1 = crypto_sign(in_stack_fffffffffffe11a8,in_stack_fffffffffffe11a0,
                              in_stack_fffffffffffe1198,
                              (unsigned_long_long)in_stack_fffffffffffe1190,
                              in_stack_fffffffffffe1188);
          if (iVar1 == 0) {
            uVar2 = crypto_sign_open(in_stack_fffffffffffe1198,in_stack_fffffffffffe1190,
                                     in_stack_fffffffffffe1188,in_stack_fffffffffffe1180,
                                     in_stack_fffffffffffe1178);
            if (uVar2 == 0) {
              printf("length of message after verify incorrect, got %llu, expected %zu\n",0x1ed84,
                     0x32);
            }
            else {
              printf("Failed to verify (ret = %d)\n",(ulong)uVar2);
            }
          }
          else {
            printf("Failed to sign\n");
          }
        }
        else {
          printf("message mismatch after verification\n");
        }
      }
      else {
        printf("Failed to verify (ret = %d)\n",(ulong)uVar2);
      }
    }
    else {
      printf("Failed to sign\n");
    }
  }
  else {
    printf("Failed to generate key pair\n");
  }
  return -1;
}

Assistant:

int main(void) {
  unsigned char pk[CRYPTO_PUBLICKEYBYTES]          = {0};
  unsigned char sk[CRYPTO_SECRETKEYBYTES]          = {0};
  const unsigned char message[50]                  = {0};
  unsigned char omessage[sizeof(message)]          = {0};
  unsigned char sm[sizeof(message) + CRYPTO_BYTES] = {0};

  int ret = crypto_sign_keypair(pk, sk);
  VALGRIND_MAKE_MEM_DEFINED(&ret, sizeof(ret));
  if (ret != 0) {
    printf("Failed to generate key pair\n");
    return -1;
  }

  VALGRIND_MAKE_MEM_UNDEFINED(sk, sizeof(sk));
  VALGRIND_MAKE_MEM_UNDEFINED(message, sizeof(message));

  unsigned long long smlen = sizeof(sm);
  ret                      = crypto_sign(sm, &smlen, message, sizeof(message), sk);
  if (ret != 0) {
    printf("Failed to sign\n");
    return -1;
  }

  VALGRIND_MAKE_MEM_DEFINED(sm, smlen);
  VALGRIND_MAKE_MEM_DEFINED(sk, sizeof(sk));
  VALGRIND_MAKE_MEM_DEFINED(message, sizeof(message));

  unsigned long long mlen = sizeof(omessage);
  ret                     = crypto_sign_open(omessage, &mlen, sm, smlen, pk);
  if (ret != 0) {
    printf("Failed to verify (ret = %d)\n", ret);
    return -1;
  }

  if (mlen != sizeof(message)) {
    printf("length of message after verify incorrect, got " LL_FMT ", expected " SIZET_FMT "\n",
           mlen, sizeof(message));
    return -1;
  }
  if (memcmp(message, omessage, sizeof(message)) != 0) {
    printf("message mismatch after verification\n");
    return -1;
  }

  // test special case where message and signature overlap
  memcpy(sm, message, sizeof(message));

  smlen = sizeof(sm);
  ret   = crypto_sign(sm, &smlen, sm, sizeof(message), sk);
  if (ret != 0) {
    printf("Failed to sign\n");
    return -1;
  }

  mlen = smlen;
  ret  = crypto_sign_open(sm, &mlen, sm, smlen, pk);
  if (ret != 0) {
    printf("Failed to verify (ret = %d)\n", ret);
    return -1;
  }

  if (mlen != sizeof(message)) {
    printf("length of message after verify incorrect, got " LL_FMT ", expected " SIZET_FMT "\n",
           mlen, sizeof(message));
    return -1;
  }
  if (memcmp(message, sm, sizeof(message)) != 0) {
    printf("message mismatch after verification\n");
    return -1;
  }

  printf("Sign/Verify test passed\n");

  return 0;
}